

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester_mq.c
# Opt level: O0

void tester_mq_finish(_Bool unlink,mqd_t tester_mq,char *tester_mq_name,_Bool *err)

{
  int local_24;
  int tmp_err;
  _Bool *err_local;
  char *tester_mq_name_local;
  mqd_t tester_mq_local;
  _Bool unlink_local;
  
  local_24 = mq_close(tester_mq);
  if (unlink) {
    local_24 = mq_unlink(tester_mq_name);
  }
  if (local_24 == -1) {
    if (err != (_Bool *)0x0) {
      *err = true;
    }
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/tester_mq.c"
                  ,"tester_mq_finish");
  }
  return;
}

Assistant:

void tester_mq_finish(bool unlink, mqd_t tester_mq, const char *tester_mq_name, bool *err) {
    assert(err != NULL);

    int tmp_err = 0;

    tmp_err = mq_close(tester_mq);
    if(unlink) {
        tmp_err = mq_unlink(tester_mq_name);
    }
    VOID_FAIL_IF(tmp_err == -1);
}